

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

int __thiscall HModel::load_fromMPS(HModel *this,char *filename)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  timeval local_40;
  
  clearModel(this);
  this->totalTime = 0.0;
  HTimer::reset(&this->timer);
  pcVar1 = (char *)(this->modelName)._M_string_length;
  strlen(filename);
  iVar5 = 0;
  std::__cxx11::string::_M_replace((ulong)&this->modelName,0,pcVar1,(ulong)filename);
  iVar2 = readMPS(filename,-1,-1,&this->numRow,&this->numCol,&this->objSense,&this->objOffset,
                  &this->Astart,&this->Aindex,&this->Avalue,&this->colCost,&this->colLower,
                  &this->colUpper,&this->rowLower,&this->rowUpper,&this->integerColumn);
  if (iVar2 == 0) {
    lVar3 = (long)this->numCol;
    if (0 < lVar3) {
      lVar4 = 0;
      iVar5 = 0;
      do {
        iVar5 = (iVar5 + 1) -
                (uint)((this->integerColumn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar4] == 0);
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    if (iVar5 != 0) {
      printf("MPS file has %d integer variables\n");
    }
    this->numTot = this->numRow + this->numCol;
    initScale(this);
    initWithLogicalBasis(this);
  }
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  this->totalTime =
       (((double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec) - (this->timer).startTime)
       + this->totalTime;
  return iVar2;
}

Assistant:

int HModel::load_fromMPS(const char *filename) {
  // Remove any current model
  clearModel();
  
  // Initialise the total runtine for this model
  totalTime = 0;

  // Load the model, timing the process
  timer.reset();
  modelName = filename;

  //setup_loadMPS(filename);

  int mxNumRow = -1;
  int mxNumCol = -1;
  int RtCd = readMPS(filename, mxNumRow, mxNumCol,
		     numRow, numCol, objSense, objOffset,
		     Astart,  Aindex, Avalue,
		     colCost, colLower, colUpper, rowLower, rowUpper,
		     integerColumn);
  if (RtCd) {
    totalTime += timer.getTime();
    return RtCd;
  }

#ifdef JAJH_dev
  int numIntegerColumn = 0;
  for (int c_n=0; c_n<numCol; c_n++) {
    if (integerColumn[c_n]) numIntegerColumn++;
  }
  if (numIntegerColumn) printf("MPS file has %d integer variables\n", numIntegerColumn);
#endif
 
  numTot = numCol + numRow;

#ifdef JAJH_dev
  //Use this next line to check the loading of a model from arrays
  //check_load_fromArrays(); return;
#endif

  // Assign and initialise the scaling factors
  initScale();
  
  // Initialise with a logical basis then allocate and populate (where
  // possible) work* arrays and allocate basis* arrays
  initWithLogicalBasis();

  totalTime += timer.getTime();
  return RtCd;
}